

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_SwapBetweenArenaAndNonArenaWithAllFieldsSet_Test::TestBody
          (ArenaTest_SwapBetweenArenaAndNonArenaWithAllFieldsSet_Test *this)

{
  TestAllTypes *message;
  ulong uVar1;
  Arena arena2;
  TestAllTypes non_arena_message;
  ThreadSafeArena TStack_3f8;
  TestAllTypes local_350;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_350);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&TStack_3f8);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&TStack_3f8);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  if (&local_350 != message) {
    uVar1 = (message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
    }
    if ((local_350.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_350.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(ulong *)(local_350.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                     0xfffffffffffffffe);
    }
    if (uVar1 == local_350.super_Message.super_MessageLite._internal_metadata_.ptr_) {
      proto2_unittest::TestAllTypes::InternalSwap(message,&local_350);
    }
    else {
      protobuf::internal::GenericSwap((Message *)message,&local_350.super_Message);
    }
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_350);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&TStack_3f8);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  return;
}

Assistant:

TEST(ArenaTest, SwapBetweenArenaAndNonArenaWithAllFieldsSet) {
  TestAllTypes non_arena_message;
  TestUtil::SetAllFields(&non_arena_message);
  {
    Arena arena2;
    TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
    TestUtil::SetAllFields(arena2_message);
    arena2_message->Swap(&non_arena_message);
    TestUtil::ExpectAllFieldsSet(*arena2_message);
    TestUtil::ExpectAllFieldsSet(non_arena_message);
  }
}